

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_tec(REF_HISTOGRAM ref_histogram,char *description)

{
  REF_STATUS RVar1;
  ulong uVar2;
  FILE *__stream;
  ulong uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_448;
  char filename [1024];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)ref_histogram->nbin;
  if (ref_histogram->nbin < 1) {
    uVar2 = uVar3;
  }
  iVar4 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar4 = iVar4 + ref_histogram->bins[uVar3];
  }
  if (iVar4 < 1) {
    local_448 = 0.0;
  }
  else {
    local_448 = 1.0 / (double)iVar4;
  }
  snprintf(filename,0x400,"ref_histogram_%s.tec",description);
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x109,"ref_histogram_tec","unable to open file");
    RVar1 = 2;
  }
  else {
    lVar5 = 0;
    while (lVar5 < (long)ref_histogram->nbin + -2) {
      iVar4 = (int)lVar5;
      dVar6 = exp2((double)(ref_histogram->nbin / -2 + iVar4 + 1) * (1.0 / ref_histogram->exp));
      dVar7 = exp2((double)(ref_histogram->nbin / -2 + iVar4) * (1.0 / ref_histogram->exp));
      dVar6 = ((double)ref_histogram->bins[lVar5] / (dVar6 - dVar7)) * local_448;
      if (dVar6 <= 1e-20) {
        dVar6 = 1e-20;
      }
      dVar7 = exp2((double)(ref_histogram->nbin / -2 + iVar4) * (1.0 / ref_histogram->exp));
      dVar8 = exp2((double)(ref_histogram->nbin / -2 + iVar4 + 1) * (1.0 / ref_histogram->exp));
      fprintf(__stream,"%.8e %.8e\n%.8e %.8e\n",dVar7,dVar6,dVar8,dVar6);
      lVar5 = lVar5 + 1;
    }
    fclose(__stream);
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_tec(REF_HISTOGRAM ref_histogram,
                                     const char *description) {
  REF_INT i;
  FILE *f;
  char filename[1024];
  REF_INT sum;
  REF_DBL norm, area, portion;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  snprintf(filename, 1024, "ref_histogram_%s.tec", description);
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 2; i++) {
    area = ref_histogram_to_obs(i + 1) - ref_histogram_to_obs(i);
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) / area * norm;
    portion = MAX(portion, 1.0e-20);
    fprintf(f, "%.8e %.8e\n%.8e %.8e\n", ref_histogram_to_obs(i), portion,
            ref_histogram_to_obs(i + 1), portion);
  }

  fclose(f);

  return REF_SUCCESS;
}